

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void __thiscall
phmap::priv::
CompressedTuple<unsigned_long,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
::~CompressedTuple(CompressedTuple<unsigned_long,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
                   *this)

{
  CompressedTuple<unsigned_long,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  *this_local;
  
  internal_compressed_tuple::
  CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  ::~CompressedTupleImpl
            (&this->
              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            );
  return;
}

Assistant:

class PHMAP_INTERNAL_COMPRESSED_TUPLE_DECLSPEC CompressedTuple
    : private internal_compressed_tuple::CompressedTupleImpl<
          CompressedTuple<Ts...>, phmap::index_sequence_for<Ts...>> 
{
private:
    template <int I>
        using ElemT = internal_compressed_tuple::ElemT<CompressedTuple, I>;

public:
    constexpr CompressedTuple() = default;
    explicit constexpr CompressedTuple(Ts... base)
        : CompressedTuple::CompressedTupleImpl(phmap::forward<Ts>(base)...) {}

    template <int I>
        ElemT<I>& get() & {
        return internal_compressed_tuple::Storage<CompressedTuple, I>::get();
    }

    template <int I>
        constexpr const ElemT<I>& get() const& {
        return internal_compressed_tuple::Storage<CompressedTuple, I>::get();
    }

    template <int I>
        ElemT<I>&& get() && {
        return std::move(*this)
            .internal_compressed_tuple::template Storage<CompressedTuple, I>::get();
    }

    template <int I>
        constexpr const ElemT<I>&& get() const&& {
        return phmap::move(*this)
            .internal_compressed_tuple::template Storage<CompressedTuple, I>::get();
    }
}